

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_init.c
# Opt level: O0

void registryHandleGlobal
               (void *userData,wl_registry *registry,uint32_t name,char *interface,uint32_t version)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t version_local;
  char *interface_local;
  uint32_t name_local;
  wl_registry *registry_local;
  void *userData_local;
  
  iVar1 = strcmp(interface,"wl_compositor");
  if (iVar1 == 0) {
    uVar2 = _glfw_min(3,version);
    _glfw.wl.compositor =
         (wl_compositor *)wl_registry_bind(registry,name,&_glfw_wl_compositor_interface,uVar2);
  }
  else {
    iVar1 = strcmp(interface,"wl_subcompositor");
    if (iVar1 == 0) {
      _glfw.wl.subcompositor =
           (wl_subcompositor *)wl_registry_bind(registry,name,&_glfw_wl_subcompositor_interface,1);
    }
    else {
      iVar1 = strcmp(interface,"wl_shm");
      if (iVar1 == 0) {
        _glfw.wl.shm = (wl_shm *)wl_registry_bind(registry,name,&_glfw_wl_shm_interface,1);
      }
      else {
        iVar1 = strcmp(interface,"wl_output");
        if (iVar1 == 0) {
          _glfwAddOutputWayland(name,version);
        }
        else {
          iVar1 = strcmp(interface,"wl_seat");
          if (iVar1 == 0) {
            if (_glfw.wl.seat == (wl_seat *)0x0) {
              uVar2 = _glfw_min(4,version);
              _glfw.wl.seat =
                   (wl_seat *)wl_registry_bind(registry,name,&_glfw_wl_seat_interface,uVar2);
              _glfwAddSeatListenerWayland(_glfw.wl.seat);
            }
          }
          else {
            iVar1 = strcmp(interface,"wl_data_device_manager");
            if (iVar1 == 0) {
              if (_glfw.wl.dataDeviceManager == (wl_data_device_manager *)0x0) {
                _glfw.wl.dataDeviceManager =
                     (wl_data_device_manager *)
                     wl_registry_bind(registry,name,&_glfw_wl_data_device_manager_interface,1);
              }
            }
            else {
              iVar1 = strcmp(interface,"xdg_wm_base");
              if (iVar1 == 0) {
                _glfw.wl.wmBase =
                     (xdg_wm_base *)wl_registry_bind(registry,name,&_glfw_xdg_wm_base_interface,1);
                xdg_wm_base_add_listener(_glfw.wl.wmBase,&wmBaseListener,(void *)0x0);
              }
              else {
                iVar1 = strcmp(interface,"zxdg_decoration_manager_v1");
                if (iVar1 == 0) {
                  _glfw.wl.decorationManager =
                       (zxdg_decoration_manager_v1 *)
                       wl_registry_bind(registry,name,&_glfw_zxdg_decoration_manager_v1_interface,1)
                  ;
                }
                else {
                  iVar1 = strcmp(interface,"wp_viewporter");
                  if (iVar1 == 0) {
                    _glfw.wl.viewporter =
                         (wp_viewporter *)
                         wl_registry_bind(registry,name,&_glfw_wp_viewporter_interface,1);
                  }
                  else {
                    iVar1 = strcmp(interface,"zwp_relative_pointer_manager_v1");
                    if (iVar1 == 0) {
                      _glfw.wl.relativePointerManager =
                           (zwp_relative_pointer_manager_v1 *)
                           wl_registry_bind(registry,name,
                                            &_glfw_zwp_relative_pointer_manager_v1_interface,1);
                    }
                    else {
                      iVar1 = strcmp(interface,"zwp_pointer_constraints_v1");
                      if (iVar1 == 0) {
                        _glfw.wl.pointerConstraints =
                             (zwp_pointer_constraints_v1 *)
                             wl_registry_bind(registry,name,
                                              &_glfw_zwp_pointer_constraints_v1_interface,1);
                      }
                      else {
                        iVar1 = strcmp(interface,"zwp_idle_inhibit_manager_v1");
                        if (iVar1 == 0) {
                          _glfw.wl.idleInhibitManager =
                               (zwp_idle_inhibit_manager_v1 *)
                               wl_registry_bind(registry,name,
                                                &_glfw_zwp_idle_inhibit_manager_v1_interface,1);
                        }
                        else {
                          iVar1 = strcmp(interface,"xdg_activation_v1");
                          if (iVar1 == 0) {
                            _glfw.wl.activationManager =
                                 (xdg_activation_v1 *)
                                 wl_registry_bind(registry,name,&_glfw_xdg_activation_v1_interface,1
                                                 );
                          }
                          else {
                            iVar1 = strcmp(interface,"wp_fractional_scale_manager_v1");
                            if (iVar1 == 0) {
                              _glfw.wl.fractionalScaleManager =
                                   (wp_fractional_scale_manager_v1 *)
                                   wl_registry_bind(registry,name,
                                                    &wp_fractional_scale_manager_v1_interface,1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void registryHandleGlobal(void* userData,
                                 struct wl_registry* registry,
                                 uint32_t name,
                                 const char* interface,
                                 uint32_t version)
{
    if (strcmp(interface, "wl_compositor") == 0)
    {
        _glfw.wl.compositor =
            wl_registry_bind(registry, name, &wl_compositor_interface,
                             _glfw_min(3, version));
    }
    else if (strcmp(interface, "wl_subcompositor") == 0)
    {
        _glfw.wl.subcompositor =
            wl_registry_bind(registry, name, &wl_subcompositor_interface, 1);
    }
    else if (strcmp(interface, "wl_shm") == 0)
    {
        _glfw.wl.shm =
            wl_registry_bind(registry, name, &wl_shm_interface, 1);
    }
    else if (strcmp(interface, "wl_output") == 0)
    {
        _glfwAddOutputWayland(name, version);
    }
    else if (strcmp(interface, "wl_seat") == 0)
    {
        if (!_glfw.wl.seat)
        {
            _glfw.wl.seat =
                wl_registry_bind(registry, name, &wl_seat_interface,
                                 _glfw_min(4, version));
            _glfwAddSeatListenerWayland(_glfw.wl.seat);
        }
    }
    else if (strcmp(interface, "wl_data_device_manager") == 0)
    {
        if (!_glfw.wl.dataDeviceManager)
        {
            _glfw.wl.dataDeviceManager =
                wl_registry_bind(registry, name,
                                 &wl_data_device_manager_interface, 1);
        }
    }
    else if (strcmp(interface, "xdg_wm_base") == 0)
    {
        _glfw.wl.wmBase =
            wl_registry_bind(registry, name, &xdg_wm_base_interface, 1);
        xdg_wm_base_add_listener(_glfw.wl.wmBase, &wmBaseListener, NULL);
    }
    else if (strcmp(interface, "zxdg_decoration_manager_v1") == 0)
    {
        _glfw.wl.decorationManager =
            wl_registry_bind(registry, name,
                             &zxdg_decoration_manager_v1_interface,
                             1);
    }
    else if (strcmp(interface, "wp_viewporter") == 0)
    {
        _glfw.wl.viewporter =
            wl_registry_bind(registry, name, &wp_viewporter_interface, 1);
    }
    else if (strcmp(interface, "zwp_relative_pointer_manager_v1") == 0)
    {
        _glfw.wl.relativePointerManager =
            wl_registry_bind(registry, name,
                             &zwp_relative_pointer_manager_v1_interface,
                             1);
    }
    else if (strcmp(interface, "zwp_pointer_constraints_v1") == 0)
    {
        _glfw.wl.pointerConstraints =
            wl_registry_bind(registry, name,
                             &zwp_pointer_constraints_v1_interface,
                             1);
    }
    else if (strcmp(interface, "zwp_idle_inhibit_manager_v1") == 0)
    {
        _glfw.wl.idleInhibitManager =
            wl_registry_bind(registry, name,
                             &zwp_idle_inhibit_manager_v1_interface,
                             1);
    }
    else if (strcmp(interface, "xdg_activation_v1") == 0)
    {
        _glfw.wl.activationManager =
            wl_registry_bind(registry, name,
                             &xdg_activation_v1_interface,
                             1);
    }
    else if (strcmp(interface, "wp_fractional_scale_manager_v1") == 0)
    {
        _glfw.wl.fractionalScaleManager =
            wl_registry_bind(registry, name,
                             &wp_fractional_scale_manager_v1_interface,
                             1);
    }
}